

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_skipped(XmlReporter *this,TestCaseData *in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_RDI;
  char *in_stack_00000020;
  string *in_stack_00000028;
  XmlWriter *in_stack_00000030;
  TestCaseData *in_stack_00000208;
  XmlReporter *in_stack_00000210;
  allocator<char> local_31;
  XmlWriter *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x78) + 0x7f) & 1) == 0) {
    test_case_start_impl(in_stack_00000210,in_stack_00000208);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)in_stack_ffffffffffffffd0);
    XmlWriter::writeAttribute(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator(&local_31);
    XmlWriter::endElement(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void test_case_skipped(const TestCaseData& in) override {
            if(opt.no_skipped_summary == false) {
                test_case_start_impl(in);
                xml.writeAttribute("skipped", "true");
                xml.endElement();
            }
        }